

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ResizeAndExtendTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::ResizeAndExtendTest_DISABLED_Speed_Test>
           *this)

{
  ResizeAndExtendTest *this_00;
  
  WithParamInterface<void(*)(yv12_buffer_config_const*,yv12_buffer_config*,InterpFilter,int,int)>::
  parameter_ = &this->parameter_;
  this_00 = (ResizeAndExtendTest *)operator_new(0x298);
  anon_unknown.dwarf_305e72::ResizeAndExtendTest::ResizeAndExtendTest(this_00);
  (this_00->
  super_TestWithParam<void_(*)(const_yv12_buffer_config_*,_yv12_buffer_config_*,_InterpFilter,_int,_int)>
  ).super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_01038bb8;
  (this_00->
  super_TestWithParam<void_(*)(const_yv12_buffer_config_*,_yv12_buffer_config_*,_InterpFilter,_int,_int)>
  ).
  super_WithParamInterface<void_(*)(const_yv12_buffer_config_*,_yv12_buffer_config_*,_InterpFilter,_int,_int)>
  ._vptr_WithParamInterface = (_func_int **)&PTR__ResizeAndExtendTest_DISABLED_Speed_Test_01038bf8;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }